

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall t_c_glib_generator::init_generator(t_c_glib_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  size_type *psVar8;
  long *plVar9;
  t_program *ptVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_include;
  pointer pptVar11;
  pointer pbVar12;
  string include_nspace_prefix;
  string f_types_impl_name;
  string program_name_u;
  string f_types_name;
  string program_name_lc;
  string program_name_uc;
  string local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  string local_1a8;
  ofstream_with_content_based_conditional_update *local_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  string local_160;
  t_c_glib_generator *local_140;
  string local_138;
  string local_118;
  pointer local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_1a8,this);
  iVar3 = mkdir(local_1a8._M_dataplus._M_p,0x1ff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((iVar3 == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_138,this);
    std::__cxx11::string::string
              ((string *)&local_118,local_138._M_dataplus._M_p,(allocator *)&local_180);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_1a8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_1a8._M_dataplus._M_p == psVar8) {
      local_1a8.field_2._M_allocated_capacity = *psVar8;
      local_1a8.field_2._8_8_ = plVar5[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar8;
    }
    local_1a8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    __rhs = strerror(*piVar4);
    std::operator+(__return_storage_ptr__,&local_1a8,__rhs);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  pcVar1 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,
             pcVar1 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  initial_caps_to_underscores(&local_1a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
  to_upper_case(&local_118,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
  to_lower_case(&local_138,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_1e8,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e8,(ulong)(this->nspace_lc)._M_dataplus._M_p);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_208.field_2._M_allocated_capacity = *psVar8;
    local_208.field_2._8_8_ = plVar5[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar8;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_138._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_1b8 = *plVar9;
    lStack_1b0 = plVar5[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar9;
    local_1c8 = (long *)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_180 = &local_170;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar5[3];
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar5;
  }
  local_178 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  std::__cxx11::string::string((string *)&local_1c8,(char *)local_180,(allocator *)&local_208);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_160,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)(this->nspace_lc)._M_dataplus._M_p);
  local_1e8 = &local_1d8;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_1d8 = *plVar9;
    lStack_1d0 = plVar5[3];
  }
  else {
    local_1d8 = *plVar9;
    local_1e8 = (long *)*plVar5;
  }
  local_1e0 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e8,(ulong)local_138._M_dataplus._M_p);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_208.field_2._M_allocated_capacity = *psVar8;
    local_208.field_2._8_8_ = plVar5[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar8;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_1b8 = *plVar9;
    lStack_1b0 = plVar5[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar9;
    local_1c8 = (long *)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_208,(char *)local_1c8,(allocator *)&local_1e8);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_impl_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  local_188 = &this->f_types_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (local_188);
  (this->f_types_impl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_208,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_208._M_dataplus._M_p,local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_208,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,local_208._M_dataplus._M_p,local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#ifndef ",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(this->nspace_uc)._M_dataplus._M_p,
                      (this->nspace_uc)._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_TYPES_H",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#define ",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_TYPES_H",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"/* base includes */",0x13);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include <glib-object.h>",0x18);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"#include <thrift/c_glib/thrift_struct.h>",0x28);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"#include <thrift/c_glib/protocol/thrift_protocol.h>",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar10 = (this->super_t_oop_generator).super_t_generator.program_;
  local_140 = this;
  if ((ptVar10->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar10->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"/* other thrift includes */",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    pptVar11 = (ptVar10->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_f8 = (ptVar10->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (pptVar11 != local_f8) {
      do {
        ptVar10 = *pptVar11;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"c_glib","");
        t_program::get_namespace(&local_208,ptVar10,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_208._M_string_length == 0) {
          local_1e8 = &local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
        }
        else {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_208._M_dataplus._M_p,
                     local_208._M_dataplus._M_p + local_208._M_string_length);
          initial_caps_to_underscores(&local_160,&local_b0);
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
          local_1e8 = &local_1d8;
          plVar5 = puVar7 + 2;
          if ((long *)*puVar7 == plVar5) {
            local_1d8 = *plVar5;
            lStack_1d0 = puVar7[3];
          }
          else {
            local_1d8 = *plVar5;
            local_1e8 = (long *)*puVar7;
          }
          local_1e0 = puVar7[1];
          *puVar7 = plVar5;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this_00,(char *)local_1e8,local_1e0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        pcVar1 = (ptVar10->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar1,pcVar1 + (ptVar10->name_)._M_string_length);
        initial_caps_to_underscores(&local_160,&local_d0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_160._M_dataplus._M_p,local_160._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types.h\"",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        pptVar11 = pptVar11 + 1;
      } while (pptVar11 != local_f8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    ptVar10 = (local_140->super_t_oop_generator).super_t_generator.program_;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"/* custom thrift includes */",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  pbVar2 = (ptVar10->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = (ptVar10->c_includes_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2; pbVar12 = pbVar12 + 1
      ) {
    if (*(pbVar12->_M_dataplus)._M_p == '<') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include ",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include <math.h>",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include \"",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(local_140->nspace_lc)._M_dataplus._M_p,
                      (local_140->nspace_lc)._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types.h\"",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"#include <thrift/c_glib/thrift.h>",0x21);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"/* begin types */",0x11);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_c_glib_generator::init_generator() {
  /* create output directory */
  MKDIR(get_out_dir().c_str());

  string program_name_u = initial_caps_to_underscores(program_name_);
  string program_name_uc = to_upper_case(program_name_u);
  string program_name_lc = to_lower_case(program_name_u);

  /* create output files */
  string f_types_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.h";
  f_types_.open(f_types_name.c_str());
  string f_types_impl_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.c";
  f_types_impl_.open(f_types_impl_name.c_str());

  /* add thrift boilerplate headers */
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();

  /* include inclusion guard */
  f_types_ << "#ifndef " << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << "#define "
           << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << endl;

  /* include base types */
  f_types_ << "/* base includes */" << endl << "#include <glib-object.h>" << endl
           << "#include <thrift/c_glib/thrift_struct.h>" << endl
           << "#include <thrift/c_glib/protocol/thrift_protocol.h>" << endl;

  /* include other thrift includes */
  const vector<t_program*>& includes = program_->get_includes();
  if (!includes.empty()) {
    f_types_ << "/* other thrift includes */" << endl;

    for (auto include : includes) {
      const std::string& include_nspace = include->get_namespace("c_glib");
      std::string include_nspace_prefix =
        include_nspace.empty() ? "" : initial_caps_to_underscores(include_nspace) + "_";

      f_types_ << "#include \"" << include_nspace_prefix
               << initial_caps_to_underscores(include->get_name()) << "_types.h\"" << endl;
    }
    f_types_ << endl;
  }

  /* include custom headers */
  const vector<string>& c_includes = program_->get_c_includes();
  f_types_ << "/* custom thrift includes */" << endl;
  for (const auto & c_include : c_includes) {
    if (c_include[0] == '<') {
      f_types_ << "#include " << c_include << endl;
    } else {
      f_types_ << "#include \"" << c_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  /* include math.h (for "INFINITY") in the implementation file, in case we
     encounter a struct with a member of type double */
  f_types_impl_ << endl << "#include <math.h>" << endl;

  // include the types file
  f_types_impl_ << endl << "#include \"" << this->nspace_lc << program_name_u << "_types.h\""
                << endl << "#include <thrift/c_glib/thrift.h>" << endl << endl;

  f_types_ << "/* begin types */" << endl << endl;
}